

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

void drwav_f64_to_s16(drwav_int16 *pOut,double *pIn,size_t sampleCount)

{
  double dVar1;
  size_t sVar2;
  ushort uVar3;
  double dVar4;
  
  if (sampleCount != 0) {
    sVar2 = 0;
    do {
      dVar1 = pIn[sVar2];
      uVar3 = 0x8000;
      if (-1.0 <= dVar1) {
        dVar4 = 1.0;
        if (dVar1 <= 1.0) {
          dVar4 = dVar1;
        }
        uVar3 = (ushort)(int)((dVar4 + 1.0) * 32767.5) ^ 0x8000;
      }
      pOut[sVar2] = uVar3;
      sVar2 = sVar2 + 1;
    } while (sampleCount != sVar2);
  }
  return;
}

Assistant:

void drwav_f64_to_s16(drwav_int16* pOut, const double* pIn, size_t sampleCount)
{
    int r;
    for (size_t i = 0; i < sampleCount; ++i) {
        double x = pIn[i];
        double c;
        c = ((x < -1) ? -1 : ((x > 1) ? 1 : x));
        c = c + 1;
        r = (int)(c * 32767.5);
        r = r - 32768;
        pOut[i] = (short)r;
    }
}